

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O3

SharedSyPtr front::symbol::IntSymbol::getHolderIntSymbol(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  IntSymbol *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  SharedSyPtr SVar3;
  string local_40;
  
  if (getHolderIntSymbol()::holder == '\0') {
    iVar2 = __cxa_guard_acquire(&getHolderIntSymbol()::holder);
    in_RDX._M_pi = extraout_RDX;
    if (iVar2 != 0) {
      this = (IntSymbol *)operator_new(0x40);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"holder","");
      IntSymbol(this,&local_40,-1,true,0);
      getHolderIntSymbol::holder.
      super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::symbol::IntSymbol*>
                (&getHolderIntSymbol::holder.
                  super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&getHolderIntSymbol::holder,&__dso_handle);
      __cxa_guard_release(&getHolderIntSymbol()::holder);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  in_RDI->_vptr_Symbol =
       (_func_int **)
       getHolderIntSymbol::holder.
       super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = getHolderIntSymbol::holder.
          super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (in_RDI->_name)._M_dataplus._M_p =
       (pointer)getHolderIntSymbol::holder.
                super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  SVar3.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar3.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedSyPtr)SVar3.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SharedSyPtr getHolderIntSymbol() {
    static SharedSyPtr holder(
        new IntSymbol("holder", Symbol::getNoLayerNum(), true));
    return holder;
  }